

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_type sVar4;
  pointer pTVar5;
  int iVar6;
  undefined4 extraout_var;
  TestSpecParser *this_00;
  IRegistryHub *pIVar7;
  undefined4 extraout_var_00;
  iterator iVar8;
  undefined4 extraout_var_01;
  _Alloc_hider __k;
  pointer pTVar9;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> skippedTestCases;
  RunContext context;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_388;
  string local_368;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_348;
  Ptr<Catch::IStreamingReporter> *local_330;
  undefined1 local_328 [32];
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_300;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  TagAliasRegistry *local_2c0;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_2b8;
  RunContext local_298;
  
  local_368._M_string_length = (size_type)local_368._M_dataplus._M_p;
  local_328._0_8_ = (this->m_config).m_p;
  if ((Config *)local_328._0_8_ != (Config *)0x0) {
    (*(((Config *)local_328._0_8_)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  local_330 = &this->m_reporter;
  RunContext::RunContext(&local_298,(Ptr<const_Catch::IConfig> *)local_328,local_330);
  if ((Config *)local_328._0_8_ != (Config *)0x0) {
    (**(code **)((long)*(IShared *)local_328._0_8_ + 0x18))();
  }
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  *(undefined1 (*) [16])&(__return_storage_ptr__->assertions).failedButOk = (undefined1  [16])0x0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  local_328._0_8_ = (IConfig *)(local_328 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"all tests","");
  RunContext::testGroupStarting(&local_298,(string *)local_328,1,1);
  if ((IConfig *)local_328._0_8_ != (IConfig *)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_);
  }
  iVar6 = (*(((this->m_config).m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_388,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar6));
  if (local_388.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_388.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_308 = 0;
    aStack_300._M_local_buf[0] = '\0';
    local_2f0 = (undefined1  [16])0x0;
    local_2e0 = (undefined1  [16])0x0;
    local_2d0 = (undefined1  [16])0x0;
    local_2c0 = &TagAliasRegistry::get::instance;
    local_368._M_dataplus._M_p = (pointer)((long)&local_368 + 0x10);
    local_328._24_8_ = &aStack_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"~[.]","");
    this_00 = TestSpecParser::parse((TestSpecParser *)local_328,&local_368);
    TestSpecParser::addFilter(this_00);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_2b8,&(this_00->m_testSpec).m_filters);
    local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_388.
                  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_388.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2b8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_388.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2b8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_388.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2b8.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_348);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_2b8);
    if (local_368._M_dataplus._M_p != (pointer)((long)&local_368 + 0x10)) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               (local_2e0 + 8));
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._24_8_ != &aStack_300) {
      operator_delete((void *)local_328._24_8_);
    }
  }
  local_368._M_dataplus._M_p = (pointer)0x0;
  local_368._M_string_length = 0;
  local_368.field_2._M_allocated_capacity = 0;
  pIVar7 = getRegistryHub();
  iVar6 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar6),&local_388,(this->m_config).m_p,&local_368,0);
  sVar4 = local_368._M_string_length;
  if (local_368._M_dataplus._M_p != (pointer)local_368._M_string_length) {
    __k._M_p = local_368._M_dataplus._M_p;
    do {
      iVar8 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&(this->m_testsAlreadyRun)._M_t,(key_type *)__k._M_p);
      sVar1 = local_298.m_totals.assertions.failed;
      if ((_Rb_tree_header *)iVar8._M_node ==
          &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
        iVar6 = (*((local_298.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])
                          ();
        if (sVar1 == (long)iVar6) break;
        RunContext::runTest((Totals *)local_328,&local_298,(TestCase *)__k._M_p);
        sVar1 = (__return_storage_ptr__->testCases).passed;
        sVar2 = (__return_storage_ptr__->testCases).failed;
        sVar3 = (__return_storage_ptr__->testCases).failedButOk;
        (__return_storage_ptr__->assertions).passed =
             (size_t)(local_328._0_8_ + (__return_storage_ptr__->assertions).passed);
        (__return_storage_ptr__->assertions).failed =
             (__return_storage_ptr__->assertions).failed + local_328._8_8_;
        (__return_storage_ptr__->assertions).failedButOk =
             (__return_storage_ptr__->assertions).failedButOk + local_328._16_8_;
        (__return_storage_ptr__->testCases).passed = (size_t)(sVar1 + local_328._24_8_);
        (__return_storage_ptr__->testCases).failed = sVar2 + local_308;
        (__return_storage_ptr__->testCases).failedButOk =
             sVar3 + CONCAT71(aStack_300._M_allocated_capacity._1_7_,aStack_300._M_local_buf[0]);
        std::
        _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
        ::_M_insert_unique<Catch::TestCase_const&>
                  ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                    *)&this->m_testsAlreadyRun,(TestCase *)__k._M_p);
      }
      __k._M_p = __k._M_p + 0x118;
    } while (__k._M_p != (pointer)sVar4);
  }
  local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar7 = getRegistryHub();
  iVar6 = (*pIVar7->_vptr_IRegistryHub[3])(pIVar7);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar6) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar6),&local_388,(this->m_config).m_p,&local_348,1);
  pTVar5 = local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar9 = local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar9 != pTVar5; pTVar9 = pTVar9 + 1) {
    (*(local_330->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
              (local_330->m_p,pTVar9);
  }
  local_328._0_8_ = (IConfig *)(local_328 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"all tests","");
  RunContext::testGroupEnded(&local_298,(string *)local_328,__return_storage_ptr__,1,1);
  if ((IConfig *)local_328._0_8_ != (IConfig *)(local_328 + 0x10)) {
    operator_delete((void *)local_328._0_8_);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_348);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&local_368);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_388);
  RunContext::~RunContext(&local_298);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "all tests", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            std::vector<TestCase> skippedTestCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, skippedTestCases, true );

            for( std::vector<TestCase>::const_iterator it = skippedTestCases.begin(), itEnd = skippedTestCases.end();
                    it != itEnd;
                    ++it )
                m_reporter->skipTest( *it );

            context.testGroupEnded( "all tests", totals, 1, 1 );
            return totals;
        }